

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManAreCubeCheckList(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot,Gia_StaAre_t *pSta)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_StaAre_t *pGStack_38;
  int iVar;
  Gia_StaAre_t *pCube;
  int fVerbose;
  Gia_StaAre_t *pSta_local;
  Gia_PtrAre_t *pRoot_local;
  Gia_ManAre_t *p_local;
  
  pGStack_38 = Gia_ManAreSta(p,*pRoot);
  do {
    iVar1 = Gia_StaIsGood(p,pGStack_38);
    if (iVar1 == 0) {
      return 1;
    }
    p->nChecks = p->nChecks + 1;
    iVar1 = Gia_StaIsUnused(pGStack_38);
    if ((iVar1 == 0) && (iVar1 = Gia_StaAreDisjoint(pSta,pGStack_38,p->nWords), iVar1 == 0)) {
      iVar1 = Gia_StaAreContain(pGStack_38,pSta,p->nWords);
      if (iVar1 != 0) {
        Gia_ManAreRycycleSta(p,pSta);
        return 0;
      }
      iVar1 = Gia_StaAreContain(pSta,pGStack_38,p->nWords);
      if (iVar1 == 0) {
        iVar1 = Gia_StaAreSharpVar(pSta,pGStack_38,p->nWords);
        if (iVar1 != -1) {
          iVar2 = Gia_StaHasValue0(pSta,iVar1);
          if ((iVar2 != 0) || (iVar2 = Gia_StaHasValue1(pSta,iVar1), iVar2 != 0)) {
            __assert_fail("!Gia_StaHasValue0(pSta, iVar) && !Gia_StaHasValue1(pSta, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra2.c"
                          ,0x3fa,
                          "int Gia_ManAreCubeCheckList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)"
                         );
          }
          iVar2 = Gia_StaHasValue0(pGStack_38,iVar1);
          iVar3 = Gia_StaHasValue1(pGStack_38,iVar1);
          if (iVar2 == iVar3) {
            __assert_fail("Gia_StaHasValue0(pCube, iVar) ^ Gia_StaHasValue1(pCube, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra2.c"
                          ,0x3fb,
                          "int Gia_ManAreCubeCheckList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)"
                         );
          }
          iVar2 = Gia_StaHasValue0(pGStack_38,iVar1);
          if (iVar2 == 0) {
            Gia_StaSetValue0(pSta,iVar1);
          }
          else {
            Gia_StaSetValue1(pSta,iVar1);
          }
        }
      }
      else {
        Gia_StaSetUnused(pGStack_38);
      }
    }
    pGStack_38 = Gia_StaNext(p,pGStack_38);
  } while( true );
}

Assistant:

static inline int Gia_ManAreCubeCheckList( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot, Gia_StaAre_t * pSta )
{
    int fVerbose = 0;
    Gia_StaAre_t * pCube;
    int iVar;
if ( fVerbose )
{
printf( "Trying cube: " );
Gia_ManArePrintCube( p, pSta );
}
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, *pRoot), pCube )
    {
        p->nChecks++;
        if ( Gia_StaIsUnused( pCube ) )
            continue;
        if ( Gia_StaAreDisjoint( pSta, pCube, p->nWords ) )
            continue;
        if ( Gia_StaAreContain( pCube, pSta, p->nWords ) )
        {
if ( fVerbose )
{
printf( "Contained in " );
Gia_ManArePrintCube( p, pCube );
}
            Gia_ManAreRycycleSta( p, pSta );
            return 0;
        }
        if ( Gia_StaAreContain( pSta, pCube, p->nWords ) )
        {
if ( fVerbose )
{
printf( "Contains     " );
Gia_ManArePrintCube( p, pCube );
}
            Gia_StaSetUnused( pCube );
            continue;
        }
        iVar = Gia_StaAreSharpVar( pSta, pCube, p->nWords );
        if ( iVar == -1 )
            continue;
if ( fVerbose )
{
printf( "Sharped by   " );
Gia_ManArePrintCube( p, pCube );
Gia_ManArePrintCube( p, pSta );
}
//        printf( "%d  %d\n", Gia_StaAreDashNum( pSta, pCube, p->nWords ), Gia_StaAreSharpVar( pSta, pCube, p->nWords ) );
        assert( !Gia_StaHasValue0(pSta, iVar) && !Gia_StaHasValue1(pSta, iVar) );
        assert(  Gia_StaHasValue0(pCube, iVar) ^  Gia_StaHasValue1(pCube, iVar) );
        if ( Gia_StaHasValue0(pCube, iVar) )
            Gia_StaSetValue1( pSta, iVar );
        else
            Gia_StaSetValue0( pSta, iVar );
//        return Gia_ManAreCubeCheckList( p, pRoot, pSta );
    }
    return 1;
}